

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsInt __thiscall HEkk::computeFactor(HEkk *this)

{
  undefined1 assert_condition;
  HighsInt HVar1;
  HighsSimplexAnalysis *in_RDI;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_00000008;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_00000010;
  HighsInt alt_debug_level;
  HighsInt rank_deficiency;
  RefactorInfo *in_stack_ffffffffffffff68;
  allocator *paVar2;
  undefined7 in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [8];
  HFactor *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  HighsInt in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  BadBasisChangeReason in_stack_ffffffffffffffbc;
  HEkk *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [44];
  HighsInt local_4;
  
  if ((in_RDI[1].before_ftran_upper_hyper_density.num_one_ & 0x100) == 0) {
    clearBadBasisChange(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    assert_condition = lpFactorRowCompatible((HEkk *)0x76d58b);
    paVar2 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"HEkk::computeFactor: lpFactorRowCompatible",paVar2);
    highsAssert((bool)assert_condition,(string *)in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    HighsSimplexAnalysis::simplexTimerStart
              (in_RDI,(HighsInt)((ulong)paVar2 >> 0x20),(HighsInt)paVar2);
    HVar1 = HSimplexNla::invert((HSimplexNla *)in_RDI);
    HighsSimplexAnalysis::simplexTimerStop
              (in_RDI,(HighsInt)((ulong)paVar2 >> 0x20),(HighsInt)paVar2);
    RefactorInfo::operator=
              ((RefactorInfo *)CONCAT17(assert_condition,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (in_stack_00000010,in_stack_00000008);
    *(undefined1 *)(in_RDI[1].AnIterTrace[3].AnIterTraceDensity + 2) = 1;
    if ((in_RDI->pivotal_row_index & 1) != 0) {
      HighsSimplexAnalysis::updateInvertFormData
                ((HighsSimplexAnalysis *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
    }
    uVar3 = 0xffffffff;
    if (HVar1 != 0) {
      uVar3 = 2;
    }
    paVar2 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"HEkk::computeFactor - original",paVar2);
    debugNlaCheckInvert((HEkk *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa4);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (HVar1 == 0) {
      *(undefined1 *)&in_RDI[1].before_ftran_upper_hyper_density.num_one_ = 1;
      *(undefined1 *)((long)&in_RDI[1].before_ftran_upper_hyper_density.num_one_ + 1) = 1;
    }
    else {
      *(undefined1 *)&in_RDI[1].before_ftran_upper_hyper_density.num_one_ = 0;
      *(undefined1 *)((long)&in_RDI[1].before_ftran_upper_hyper_density.num_one_ + 1) = 0;
    }
    *(undefined4 *)
     ((long)&in_RDI[1].cleanup_primal_change_distribution.distribution_name_._M_string_length + 4) =
         0;
    *(int *)(in_RDI[1].AnIterTrace[8].AnIterTraceDensity + 1) =
         *(int *)(in_RDI[1].AnIterTrace[8].AnIterTraceDensity + 1) + 1;
    local_4 = HVar1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

HighsInt HEkk::computeFactor() {
  assert(status_.has_nla);
  if (status_.has_fresh_invert) return 0;
  // Clear any bad basis changes
  clearBadBasisChange();
  highsAssert(lpFactorRowCompatible(),
              "HEkk::computeFactor: lpFactorRowCompatible");
  // Perform INVERT
  analysis_.simplexTimerStart(InvertClock);
  const HighsInt rank_deficiency = simplex_nla_.invert();
  analysis_.simplexTimerStop(InvertClock);
  //
  // Set up hot start information
  hot_start_.refactor_info = simplex_nla_.factor_.refactor_info_;
  hot_start_.nonbasicMove = basis_.nonbasicMove_;
  hot_start_.valid = true;

  if (analysis_.analyse_factor_data)
    analysis_.updateInvertFormData(simplex_nla_.factor_);

  HighsInt alt_debug_level = -1;
  if (rank_deficiency) alt_debug_level = kHighsDebugLevelCostly;
  debugNlaCheckInvert("HEkk::computeFactor - original", alt_debug_level);

  if (rank_deficiency) {
    // Have an invertible representation, but of B with column(s)
    // replacements due to singularity. So no (fresh) representation of
    // B^{-1}
    status_.has_invert = false;
    status_.has_fresh_invert = false;
  } else {
    // Now have a representation of B^{-1}, and it is fresh!
    status_.has_invert = true;
    status_.has_fresh_invert = true;
  }
  // Set the update count to zero since the corrected invertible
  // representation may be used for an initial basis. In any case the
  // number of updates shouldn't be positive
  info_.update_count = 0;

  simplex_stats_.num_invert++;
  return rank_deficiency;
}